

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_aead_transform(ptls_aead_context_t *ctx,void *output,size_t *outlen,void *input,
                       size_t inlen,uint8_t enc_content_type)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  uint8_t iv [16];
  void *local_50;
  undefined1 local_48 [24];
  
  sVar4 = ctx->algo->iv_size;
  if (sVar4 - 8 != 0) {
    local_50 = output;
    memcpy(local_48,ctx->static_iv,sVar4 - 8);
    output = local_50;
  }
  uVar1 = ctx->seq;
  lVar3 = 0x38;
  do {
    local_48[sVar4 - 8] = (byte)(uVar1 >> ((byte)lVar3 & 0x3f)) ^ ctx->static_iv[sVar4 - 8];
    sVar4 = sVar4 + 1;
    lVar3 = lVar3 + -8;
  } while (lVar3 != -8);
  iVar2 = (*ctx->do_transform)(ctx,output,outlen,input,inlen,local_48,enc_content_type);
  if (iVar2 == 0) {
    ctx->seq = ctx->seq + 1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int ptls_aead_transform(ptls_aead_context_t *ctx, void *output, size_t *outlen, const void *input, size_t inlen,
                        uint8_t enc_content_type)
{
    uint8_t iv[PTLS_MAX_IV_SIZE];
    size_t iv_size = ctx->algo->iv_size;
    int ret;

    { /* build iv */
        const uint8_t *s = ctx->static_iv;
        uint8_t *d = iv;
        size_t i = iv_size - 8;
        for (; i != 0; --i)
            *d++ = *s++;
        i = 64;
        do {
            i -= 8;
            *d++ = *s++ ^ (uint8_t)(ctx->seq >> i);
        } while (i != 0);
    }

    if ((ret = ctx->do_transform(ctx, output, outlen, input, inlen, iv, enc_content_type)) != 0)
        return ret;

    ++ctx->seq;
    return 0;
}